

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O0

int OPENSSL_gmtime_adj(tm *tm,int offset_day,int64_t offset_sec)

{
  int iVar1;
  long local_30;
  int64_t posix_time;
  int64_t offset_sec_local;
  tm *ptStack_18;
  int offset_day_local;
  tm *tm_local;
  
  posix_time = offset_sec;
  offset_sec_local._4_4_ = offset_day;
  ptStack_18 = tm;
  iVar1 = OPENSSL_tm_to_posix(tm,&local_30);
  if (iVar1 == 0) {
    tm_local._4_4_ = 0;
  }
  else {
    local_30 = (long)offset_sec_local._4_4_ * 0x15180 + local_30;
    if ((local_30 < 1) || (posix_time <= 0x7fffffffffffffff - local_30)) {
      if ((local_30 < 0) && (posix_time < -0x8000000000000000 - local_30)) {
        tm_local._4_4_ = 0;
      }
      else {
        local_30 = posix_time + local_30;
        iVar1 = OPENSSL_posix_to_tm(local_30,ptStack_18);
        if (iVar1 == 0) {
          tm_local._4_4_ = 0;
        }
        else {
          tm_local._4_4_ = 1;
        }
      }
    }
    else {
      tm_local._4_4_ = 0;
    }
  }
  return tm_local._4_4_;
}

Assistant:

int OPENSSL_gmtime_adj(struct tm *tm, int offset_day, int64_t offset_sec) {
  int64_t posix_time;
  if (!OPENSSL_tm_to_posix(tm, &posix_time)) {
    return 0;
  }
  static_assert(INT_MAX <= INT64_MAX / SECS_PER_DAY,
                "day offset in seconds cannot overflow");
  static_assert(MAX_POSIX_TIME <= INT64_MAX - INT_MAX * SECS_PER_DAY,
                "addition cannot overflow");
  static_assert(MIN_POSIX_TIME >= INT64_MIN - INT_MIN * SECS_PER_DAY,
                "addition cannot underflow");
  posix_time += offset_day * SECS_PER_DAY;
  if (posix_time > 0 && offset_sec > INT64_MAX - posix_time) {
    return 0;
  }
  if (posix_time < 0 && offset_sec < INT64_MIN - posix_time) {
    return 0;
  }
  posix_time += offset_sec;

  if (!OPENSSL_posix_to_tm(posix_time, tm)) {
    return 0;
  }

  return 1;
}